

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_enum.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::EnumGenerator::GenerateSource
          (EnumGenerator *this,Printer *printer)

{
  undefined4 key;
  pointer ppVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  reference ppEVar5;
  string *psVar6;
  ulong uVar7;
  size_t sVar8;
  EnumValueDescriptor *descriptor;
  EnumValueDescriptor *descriptor_00;
  EnumValueDescriptor *descriptor_01;
  string local_1c8;
  int local_1a4;
  undefined1 local_1a0 [4];
  int i_3;
  string local_180;
  string local_160;
  int local_13c;
  undefined1 local_138 [4];
  int i_2;
  string local_118;
  string local_f8;
  int local_d4;
  undefined1 local_d0 [4];
  int i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_80 [8];
  string short_name;
  string local_58 [4];
  int i;
  string text_blob;
  undefined1 local_30 [4];
  int enum_value_description_key;
  TextFormatDecodeData text_format_decode_data;
  Printer *printer_local;
  EnumGenerator *this_local;
  
  text_format_decode_data.entries_.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)printer;
  io::Printer::Print<char[5],std::__cxx11::string>
            (printer,"#pragma mark - Enum $name$\n\n",(char (*) [5])0x77db8d,&this->name_);
  TextFormatDecodeData::TextFormatDecodeData((TextFormatDecodeData *)local_30);
  text_blob.field_2._12_4_ = 0xffffffff;
  std::__cxx11::string::string(local_58);
  for (short_name.field_2._12_4_ = 0; uVar3 = (ulong)(int)short_name.field_2._12_4_,
      sVar4 = std::
              vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              ::size(&this->all_values_), uVar3 < sVar4;
      short_name.field_2._12_4_ = short_name.field_2._12_4_ + 1) {
    text_blob.field_2._12_4_ = text_blob.field_2._12_4_ + 1;
    ppEVar5 = std::
              vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              ::operator[](&this->all_values_,(long)(int)short_name.field_2._12_4_);
    EnumValueShortName_abi_cxx11_((string *)local_80,(objectivec *)*ppEVar5,descriptor);
    std::operator+(&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   '\0');
    std::__cxx11::string::operator+=(local_58,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    UnCamelCaseEnumShortName((string *)local_d0,(string *)local_80);
    ppEVar5 = std::
              vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              ::operator[](&this->all_values_,(long)(int)short_name.field_2._12_4_);
    psVar6 = EnumValueDescriptor::name_abi_cxx11_(*ppEVar5);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_d0,psVar6);
    std::__cxx11::string::~string((string *)local_d0);
    key = text_blob.field_2._12_4_;
    if (bVar2) {
      ppEVar5 = std::
                vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ::operator[](&this->all_values_,(long)(int)short_name.field_2._12_4_);
      psVar6 = EnumValueDescriptor::name_abi_cxx11_(*ppEVar5);
      TextFormatDecodeData::AddString
                ((TextFormatDecodeData *)local_30,key,(string *)local_80,psVar6);
    }
    std::__cxx11::string::~string((string *)local_80);
  }
  io::Printer::Print<char[5],std::__cxx11::string>
            ((Printer *)
             text_format_decode_data.entries_.
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             "GPBEnumDescriptor *$name$_EnumDescriptor(void) {\n  static _Atomic(GPBEnumDescriptor*) descriptor = nil;\n  if (!descriptor) {\n"
             ,(char (*) [5])0x77db8d,&this->name_);
  io::Printer::Print<>
            ((Printer *)
             text_format_decode_data.entries_.
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             "    static const char *valueNames =");
  for (local_d4 = 0; uVar3 = (ulong)local_d4, uVar7 = std::__cxx11::string::size(),
      ppVar1 = text_format_decode_data.entries_.
               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage, uVar3 < uVar7;
      local_d4 = local_d4 + 0x28) {
    std::__cxx11::string::substr((ulong)local_138,(ulong)local_58);
    CEscape(&local_118,(string *)local_138);
    EscapeTrigraphs(&local_f8,&local_118);
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)ppVar1,"\n        \"$data$\"",(char (*) [5])0x77a837,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)local_138);
  }
  io::Printer::Print<>
            ((Printer *)
             text_format_decode_data.entries_.
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             ";\n    static const int32_t values[] = {\n");
  for (local_13c = 0; uVar3 = (ulong)local_13c,
      sVar4 = std::
              vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              ::size(&this->all_values_),
      ppVar1 = text_format_decode_data.entries_.
               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage, uVar3 < sVar4;
      local_13c = local_13c + 1) {
    ppEVar5 = std::
              vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              ::operator[](&this->all_values_,(long)local_13c);
    EnumValueName_abi_cxx11_(&local_160,(objectivec *)*ppEVar5,descriptor_00);
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)ppVar1,"        $name$,\n",(char (*) [5])0x77db8d,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
  }
  io::Printer::Print<>
            ((Printer *)
             text_format_decode_data.entries_.
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,"    };\n");
  sVar8 = TextFormatDecodeData::num_entries((TextFormatDecodeData *)local_30);
  ppVar1 = text_format_decode_data.entries_.
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (sVar8 == 0) {
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)
               text_format_decode_data.entries_.
               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
               "    GPBEnumDescriptor *worker =\n        [GPBEnumDescriptor allocDescriptorForName:GPBNSStringifySymbol($name$)\n                                       valueNames:valueNames\n                                           values:values\n                                            count:(uint32_t)(sizeof(values) / sizeof(int32_t))\n                                     enumVerifier:$name$_IsValidValue];\n"
               ,(char (*) [5])0x77db8d,&this->name_);
  }
  else {
    TextFormatDecodeData::Data_abi_cxx11_((string *)local_1a0,(TextFormatDecodeData *)local_30);
    CEscape(&local_180,(string *)local_1a0);
    io::Printer::Print<char[5],std::__cxx11::string,char[20],std::__cxx11::string>
              ((Printer *)ppVar1,
               "    static const char *extraTextFormatInfo = \"$extraTextFormatInfo$\";\n    GPBEnumDescriptor *worker =\n        [GPBEnumDescriptor allocDescriptorForName:GPBNSStringifySymbol($name$)\n                                       valueNames:valueNames\n                                           values:values\n                                            count:(uint32_t)(sizeof(values) / sizeof(int32_t))\n                                     enumVerifier:$name$_IsValidValue\n                              extraTextFormatInfo:extraTextFormatInfo];\n"
               ,(char (*) [5])0x77db8d,&this->name_,(char (*) [20])"extraTextFormatInfo",&local_180)
    ;
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)local_1a0);
  }
  io::Printer::Print<>
            ((Printer *)
             text_format_decode_data.entries_.
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             "    GPBEnumDescriptor *expected = nil;\n    if (!atomic_compare_exchange_strong(&descriptor, &expected, worker)) {\n      [worker release];\n    }\n  }\n  return descriptor;\n}\n\n"
            );
  io::Printer::Print<char[5],std::__cxx11::string>
            ((Printer *)
             text_format_decode_data.entries_.
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             "BOOL $name$_IsValidValue(int32_t value__) {\n  switch (value__) {\n",
             (char (*) [5])0x77db8d,&this->name_);
  for (local_1a4 = 0; uVar3 = (ulong)local_1a4,
      sVar4 = std::
              vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              ::size(&this->base_values_),
      ppVar1 = text_format_decode_data.entries_.
               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage, uVar3 < sVar4;
      local_1a4 = local_1a4 + 1) {
    ppEVar5 = std::
              vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              ::operator[](&this->base_values_,(long)local_1a4);
    EnumValueName_abi_cxx11_(&local_1c8,(objectivec *)*ppEVar5,descriptor_01);
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)ppVar1,"    case $name$:\n",(char (*) [5])0x77db8d,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  io::Printer::Print<>
            ((Printer *)
             text_format_decode_data.entries_.
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             "      return YES;\n    default:\n      return NO;\n  }\n}\n\n");
  std::__cxx11::string::~string(local_58);
  TextFormatDecodeData::~TextFormatDecodeData((TextFormatDecodeData *)local_30);
  return;
}

Assistant:

void EnumGenerator::GenerateSource(io::Printer* printer) {
  printer->Print(
      "#pragma mark - Enum $name$\n"
      "\n",
      "name", name_);

  // Note: For the TextFormat decode info, we can't use the enum value as
  // the key because protocol buffer enums have 'allow_alias', which lets
  // a value be used more than once. Instead, the index into the list of
  // enum value descriptions is used. Note: start with -1 so the first one
  // will be zero.
  TextFormatDecodeData text_format_decode_data;
  int enum_value_description_key = -1;
  std::string text_blob;

  for (int i = 0; i < all_values_.size(); i++) {
    ++enum_value_description_key;
    std::string short_name(EnumValueShortName(all_values_[i]));
    text_blob += short_name + '\0';
    if (UnCamelCaseEnumShortName(short_name) != all_values_[i]->name()) {
      text_format_decode_data.AddString(enum_value_description_key, short_name,
                                        all_values_[i]->name());
    }
  }

  printer->Print(
      "GPBEnumDescriptor *$name$_EnumDescriptor(void) {\n"
      "  static _Atomic(GPBEnumDescriptor*) descriptor = nil;\n"
      "  if (!descriptor) {\n",
      "name", name_);

  static const int kBytesPerLine = 40;  // allow for escaping
  printer->Print(
      "    static const char *valueNames =");
  for (int i = 0; i < text_blob.size(); i += kBytesPerLine) {
    printer->Print(
        "\n        \"$data$\"",
        "data", EscapeTrigraphs(CEscape(text_blob.substr(i, kBytesPerLine))));
  }
  printer->Print(
      ";\n"
      "    static const int32_t values[] = {\n");
  for (int i = 0; i < all_values_.size(); i++) {
    printer->Print("        $name$,\n",  "name", EnumValueName(all_values_[i]));
  }
  printer->Print("    };\n");

  if (text_format_decode_data.num_entries() == 0) {
    printer->Print(
        "    GPBEnumDescriptor *worker =\n"
        "        [GPBEnumDescriptor allocDescriptorForName:GPBNSStringifySymbol($name$)\n"
        "                                       valueNames:valueNames\n"
        "                                           values:values\n"
        "                                            count:(uint32_t)(sizeof(values) / sizeof(int32_t))\n"
        "                                     enumVerifier:$name$_IsValidValue];\n",
        "name", name_);
    } else {
      printer->Print(
        "    static const char *extraTextFormatInfo = \"$extraTextFormatInfo$\";\n"
        "    GPBEnumDescriptor *worker =\n"
        "        [GPBEnumDescriptor allocDescriptorForName:GPBNSStringifySymbol($name$)\n"
        "                                       valueNames:valueNames\n"
        "                                           values:values\n"
        "                                            count:(uint32_t)(sizeof(values) / sizeof(int32_t))\n"
        "                                     enumVerifier:$name$_IsValidValue\n"
        "                              extraTextFormatInfo:extraTextFormatInfo];\n",
        "name", name_,
        "extraTextFormatInfo", CEscape(text_format_decode_data.Data()));
    }
    printer->Print(
      "    GPBEnumDescriptor *expected = nil;\n"
      "    if (!atomic_compare_exchange_strong(&descriptor, &expected, worker)) {\n"
      "      [worker release];\n"
      "    }\n"
      "  }\n"
      "  return descriptor;\n"
      "}\n\n");

  printer->Print(
      "BOOL $name$_IsValidValue(int32_t value__) {\n"
      "  switch (value__) {\n",
      "name", name_);

  for (int i = 0; i < base_values_.size(); i++) {
    printer->Print(
        "    case $name$:\n",
        "name", EnumValueName(base_values_[i]));
  }

  printer->Print(
      "      return YES;\n"
      "    default:\n"
      "      return NO;\n"
      "  }\n"
      "}\n\n");
}